

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Session * UA_SecureChannel_getSession(UA_SecureChannel *channel,UA_NodeId *token)

{
  UA_Boolean UVar1;
  SessionEntry *local_28;
  SessionEntry *se;
  UA_NodeId *token_local;
  UA_SecureChannel *channel_local;
  
  local_28 = (channel->sessions).lh_first;
  while ((local_28 != (SessionEntry *)0x0 &&
         (UVar1 = UA_NodeId_equal(&local_28->session->authenticationToken,token), !UVar1))) {
    local_28 = (local_28->pointers).le_next;
  }
  if (local_28 == (SessionEntry *)0x0) {
    channel_local = (UA_SecureChannel *)0x0;
  }
  else {
    channel_local = (UA_SecureChannel *)local_28->session;
  }
  return (UA_Session *)channel_local;
}

Assistant:

UA_Session * UA_SecureChannel_getSession(UA_SecureChannel *channel, UA_NodeId *token) {
    struct SessionEntry *se;
    LIST_FOREACH(se, &channel->sessions, pointers) {
        if(UA_NodeId_equal(&se->session->authenticationToken, token))
            break;
    }
    if(!se)
        return NULL;
    return se->session;
}